

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpi.c
# Opt level: O1

int Waitany(IceTCommunicator self,int count,IceTCommRequest *array_of_requests)

{
  void *__ptr;
  MPI_Request poVar1;
  int iVar2;
  int local_24;
  
  __ptr = malloc((long)count << 3);
  if (__ptr == (void *)0x0) {
    icetRaiseDiagnostic("Could not allocate array for MPI requests.",0xfffffffc,1,
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/kmorel[P]IceT/src/communication/mpi.c"
                        ,0x1b7);
    iVar2 = -1;
  }
  else {
    local_24 = 0;
    if (0 < count) {
      do {
        poVar1 = getMPIRequest(array_of_requests[local_24]);
        *(MPI_Request *)((long)__ptr + (long)local_24 * 8) = poVar1;
        local_24 = local_24 + 1;
      } while (local_24 < count);
    }
    MPI_Waitany(count,__ptr,&local_24,0);
    setMPIRequest(array_of_requests[local_24],*(MPI_Request *)((long)__ptr + (long)local_24 * 8));
    destroy_request(array_of_requests[local_24]);
    iVar2 = local_24;
    array_of_requests[local_24] = (IceTCommRequest)0x0;
    free(__ptr);
  }
  return iVar2;
}

Assistant:

static int  Waitany(IceTCommunicator self,
                    int count, IceTCommRequest *array_of_requests)
{
    MPI_Request *mpi_requests;
    int idx;

    /* To remove warning */
    (void)self;

    mpi_requests = malloc(sizeof(MPI_Request)*count);
    if (mpi_requests == NULL) {
        icetRaiseError("Could not allocate array for MPI requests.",
                       ICET_OUT_OF_MEMORY);
        return -1;
    }

    for (idx = 0; idx < count; idx++) {
        mpi_requests[idx] = getMPIRequest(array_of_requests[idx]);
    }

    MPI_Waitany(count, mpi_requests, &idx, MPI_STATUS_IGNORE);

    setMPIRequest(array_of_requests[idx], mpi_requests[idx]);
    destroy_request(array_of_requests[idx]);
    array_of_requests[idx] = ICET_COMM_REQUEST_NULL;

    free(mpi_requests);

    return idx;
}